

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

Vec_Wrd_t * Abc_SuppGen(int m,int n)

{
  byte bVar1;
  Vec_Wrd_t *p;
  uint uVar2;
  ulong uVar3;
  ulong Entry;
  
  p = Vec_WrdAlloc(1000);
  bVar1 = (byte)n & 0x1f;
  Entry = 0;
  uVar3 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar3 = Entry;
  }
  for (; uVar3 != Entry; Entry = Entry + 1) {
    uVar2 = (int)Entry - ((uint)(Entry >> 1) & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    if (((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18 == m) {
      Vec_WrdPush(p,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_SuppGen( int m, int n )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i, Size = (1 << n);
    for ( i = 0; i < Size; i++ )
        if ( Abc_SuppCountOnes(i) == m )
            Vec_WrdPush( vRes, i );
    return vRes;
}